

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_LdArrGeneric<Js::OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_AsmTypedArr<Js::LayoutSizePolicy<(Js::LayoutSize)2>_> *playout)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  undefined4 extraout_var;
  JavascriptArrayBuffer *pJVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 *puVar8;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  ulong uVar9;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  ulong uVar10;
  undefined4 uVar11;
  undefined8 uVar12;
  
  if (TYPE_UINT32_TO_INT64 < playout->ViewType) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InterpreterStackFrame.cpp"
                                ,0x231f,"((0))","UNREACHED");
    if (bVar3) {
      *puVar8 = 0;
      return;
    }
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  uVar1 = *(uint *)(*(long *)(this + 0x118) + (ulong)playout->SlotIndex * 4);
  uVar9 = (ulong)uVar1;
  switch(playout->ViewType) {
  case TYPE_INT8:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar6 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    uVar5 = 0;
    if (uVar1 < uVar6) {
      uVar5 = (uint)*(char *)(CONCAT44(extraout_var_07,iVar4) + uVar9);
    }
    goto LAB_00a67275;
  case TYPE_UINT8:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar6 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    uVar5 = 0;
    if (uVar1 < uVar6) {
      uVar5 = (uint)*(byte *)(CONCAT44(extraout_var_08,iVar4) + uVar9);
    }
    goto LAB_00a67275;
  case TYPE_INT16:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar6 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    uVar5 = 0;
    if ((uVar1 & 0xfffffffe) < uVar6) {
      uVar5 = (uint)*(short *)(CONCAT44(extraout_var_04,iVar4) + (ulong)(uVar1 & 0xfffffffe));
    }
    goto LAB_00a67275;
  case TYPE_UINT16:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar6 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    uVar5 = 0;
    if ((uVar1 & 0xfffffffe) < uVar6) {
      uVar5 = (uint)*(ushort *)(CONCAT44(extraout_var_06,iVar4) + (ulong)(uVar1 & 0xfffffffe));
    }
    goto LAB_00a67275;
  default:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar6 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    uVar5 = 0;
    if ((uVar1 & 0xfffffffc) < uVar6) {
      uVar5 = *(uint *)(CONCAT44(extraout_var,iVar4) + (ulong)(uVar1 & 0xfffffffc));
    }
LAB_00a67275:
    *(uint *)(*(long *)(this + 0x118) + uVar10 * 4) = uVar5;
    return;
  case TYPE_FLOAT32:
    uVar5 = playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar6 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if ((uVar1 & 0xfffffffc) < uVar6) {
      uVar11 = *(undefined4 *)(CONCAT44(extraout_var_10,iVar4) + (ulong)(uVar1 & 0xfffffffc));
    }
    else {
      uVar11 = 0x7fc00000;
    }
    *(undefined4 *)(*(long *)(this + 0x130) + (ulong)uVar5 * 4) = uVar11;
    return;
  case TYPE_FLOAT64:
    uVar5 = playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar6 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if ((uVar1 & 0xfffffff8) < uVar6) {
      uVar12 = *(undefined8 *)(CONCAT44(extraout_var_05,iVar4) + (ulong)(uVar1 & 0xfffffff8));
    }
    else {
      uVar12 = 0x7ff8000000000000;
    }
    *(undefined8 *)(*(long *)(this + 0x128) + (ulong)uVar5 * 8) = uVar12;
    return;
  case TYPE_INT64:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar5 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if ((uVar1 & 0xfffffff8) < uVar5) {
      uVar9 = *(ulong *)(CONCAT44(extraout_var_12,iVar4) + (ulong)(uVar1 & 0xfffffff8));
      goto LAB_00a67378;
    }
    break;
  case TYPE_INT8_TO_INT64:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar5 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if (uVar1 < uVar5) {
      uVar9 = (ulong)*(char *)(CONCAT44(extraout_var_03,iVar4) + uVar9);
      goto LAB_00a67378;
    }
    break;
  case TYPE_UINT8_TO_INT64:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar5 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if (uVar1 < uVar5) {
      uVar9 = (ulong)*(byte *)(CONCAT44(extraout_var_11,iVar4) + uVar9);
      goto LAB_00a67378;
    }
    break;
  case TYPE_INT16_TO_INT64:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar5 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if ((uVar1 & 0xfffffffe) < uVar5) {
      uVar9 = (ulong)*(short *)(CONCAT44(extraout_var_01,iVar4) + (ulong)(uVar1 & 0xfffffffe));
      goto LAB_00a67378;
    }
    break;
  case TYPE_UINT16_TO_INT64:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar5 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if ((uVar1 & 0xfffffffe) < uVar5) {
      uVar9 = (ulong)*(ushort *)(CONCAT44(extraout_var_02,iVar4) + (ulong)(uVar1 & 0xfffffffe));
      goto LAB_00a67378;
    }
    break;
  case TYPE_INT32_TO_INT64:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar5 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if ((uVar1 & 0xfffffffc) < uVar5) {
      uVar9 = (ulong)*(int *)(CONCAT44(extraout_var_09,iVar4) + (ulong)(uVar1 & 0xfffffffc));
      goto LAB_00a67378;
    }
    break;
  case TYPE_UINT32_TO_INT64:
    uVar10 = (ulong)playout->Value;
    pJVar7 = GetAsmJsBuffer(this);
    iVar4 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x72])(pJVar7);
    uVar5 = (*(pJVar7->super_ArrayBuffer).super_ArrayBufferBase.super_DynamicObject.
              super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x71])(pJVar7);
    if ((uVar1 & 0xfffffffc) < uVar5) {
      uVar9 = (ulong)*(uint *)(CONCAT44(extraout_var_00,iVar4) + (ulong)(uVar1 & 0xfffffffc));
      goto LAB_00a67378;
    }
  }
  uVar9 = 0;
LAB_00a67378:
  *(ulong *)(*(long *)(this + 0x120) + uVar10 * 8) = uVar9;
  return;
}

Assistant:

void InterpreterStackFrame::OP_LdArrGeneric(const unaligned T* playout)
    {
        const uint32 index = (uint32)GetRegRawInt(playout->SlotIndex);
        switch (playout->ViewType)
        {
#define ARRAYBUFFER_VIEW(name, align, RegType, MemType, ...) \
        case ArrayBufferView::ViewType::TYPE_##name: \
            OP_LdArr<MemType, RegType>(index & ARRAYBUFFER_VIEW_MASK(align), playout->Value); \
            return;
#include "AsmJsArrayBufferViews.h"
        default:Assert(UNREACHED);
        }
    }